

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prototype_factory.cpp
# Opt level: O2

int main(void)

{
  ostream *poVar1;
  allocator<char> local_59;
  unique_ptr<Contact,_std::default_delete<Contact>_> jane;
  unique_ptr<Contact,_std::default_delete<Contact>_> john;
  string local_48;
  string local_28;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,"John Doe",(allocator<char> *)&jane);
  EmployeeFactory::make_main_office_employee((EmployeeFactory *)&john,&local_28,100);
  std::__cxx11::string::~string((string *)&local_28);
  poVar1 = operator<<((ostream *)&std::cout,
                      (Contact *)
                      john._M_t.super___uniq_ptr_impl<Contact,_std::default_delete<Contact>_>._M_t.
                      super__Tuple_impl<0UL,_Contact_*,_std::default_delete<Contact>_>.
                      super__Head_base<0UL,_Contact_*,_false>._M_head_impl);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"Jane Doe",&local_59);
  EmployeeFactory::make_aux_office_employee((EmployeeFactory *)&jane,&local_48,0x65);
  std::__cxx11::string::~string((string *)&local_48);
  poVar1 = operator<<((ostream *)&std::cout,
                      (Contact *)
                      jane._M_t.super___uniq_ptr_impl<Contact,_std::default_delete<Contact>_>._M_t.
                      super__Tuple_impl<0UL,_Contact_*,_std::default_delete<Contact>_>.
                      super__Head_base<0UL,_Contact_*,_false>._M_head_impl);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::unique_ptr<Contact,_std::default_delete<Contact>_>::~unique_ptr(&jane);
  std::unique_ptr<Contact,_std::default_delete<Contact>_>::~unique_ptr(&john);
  return 0;
}

Assistant:

int main()
{
	// Customize John
	auto john{EmployeeFactory::make_main_office_employee("John Doe", 100)};
	std::cout << *john << std::endl;

	// Customize Jane
	auto jane{EmployeeFactory::make_aux_office_employee("Jane Doe", 101)};
	std::cout << *jane << std::endl;

	return 0;
}